

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_ScriptRunning(FParser *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  if (this->t_argc < 1) {
    script_error("not enough arguments to function\n");
    return;
  }
  iVar2 = intvalue(this->t_argv);
  lVar3 = *(long *)((long)DFraggleThinker::ActiveThinker.field_0 + 0x40);
  do {
    lVar1 = *(long *)(lVar3 + 200);
    if (lVar1 == 0) {
LAB_0050c04e:
      (this->t_return).type = 1;
      (this->t_return).value.i = 0;
      return;
    }
    if ((*(byte *)(lVar1 + 0x20) & 0x20) != 0) {
      *(undefined8 *)(lVar3 + 200) = 0;
      goto LAB_0050c04e;
    }
    lVar3 = lVar1;
    if (*(int *)(*(long *)(lVar1 + 0x28) + 0x30) == iVar2) {
      (this->t_return).type = 1;
      (this->t_return).value.i = 1;
      return;
    }
  } while( true );
}

Assistant:

void FParser::SF_ScriptRunning()
{
	DRunningScript *current;
	int snum = 0;
	
	if(t_argc < 1)
	{
		script_error("not enough arguments to function\n");
		return;
	}
	
	snum = intvalue(t_argv[0]);  
	
	for(current = DFraggleThinker::ActiveThinker->RunningScripts->next; current; current=current->next)
	{
		if(current->script->scriptnum == snum)
		{
			// script found so return
			t_return.type = svt_int;
			t_return.value.i = 1;
			return;
		}
	}
	
	// script not found
	t_return.type = svt_int;
	t_return.value.i = 0;
}